

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_gpio_set(uint8_t pin)

{
  uint8_t shift;
  uint32_t *paddr;
  uint8_t pin_local;
  
  bcm2835_peri_write(bcm2835_gpio + (long)(int)(pin / 0x20) + 7,1 << pin % 0x20);
  return;
}

Assistant:

void bcm2835_gpio_set(uint8_t pin)
{
    volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPSET0/4 + pin/32;
    uint8_t shift = pin % 32;
    bcm2835_peri_write(paddr, 1 << shift);
}